

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

unique_ptr<Catch::ColourImpl> __thiscall
Catch::makeColourImpl(Catch *this,ColourMode implSelection,IStream *stream)

{
  bool bVar1;
  ReusableStringStream *pRVar2;
  uint local_84;
  ReusableStringStream local_80;
  string local_70;
  unique_ptr<Catch::(anonymous_namespace)::NoColourImpl> local_50;
  unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl> local_48;
  unique_ptr<Catch::(anonymous_namespace)::NoColourImpl> local_40 [3];
  unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl> local_28;
  IStream *local_20;
  IStream *stream_local;
  Catch *pCStack_10;
  ColourMode implSelection_local;
  
  local_20 = stream;
  stream_local._7_1_ = implSelection;
  pCStack_10 = this;
  if (implSelection == ANSI) {
    Detail::make_unique<Catch::(anonymous_namespace)::ANSIColourImpl,Catch::IStream*&>
              ((Detail *)&local_28,&local_20);
    Detail::unique_ptr<Catch::ColourImpl>::
    unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl,void>
              ((unique_ptr<Catch::ColourImpl> *)this,&local_28);
    Detail::unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl>::~unique_ptr(&local_28);
  }
  else if (implSelection == None) {
    Detail::make_unique<Catch::(anonymous_namespace)::NoColourImpl,Catch::IStream*&>
              ((Detail *)local_40,&local_20);
    Detail::unique_ptr<Catch::ColourImpl>::
    unique_ptr<Catch::(anonymous_namespace)::NoColourImpl,void>
              ((unique_ptr<Catch::ColourImpl> *)this,local_40);
    Detail::unique_ptr<Catch::(anonymous_namespace)::NoColourImpl>::~unique_ptr(local_40);
  }
  else {
    if (implSelection != PlatformDefault) {
      ReusableStringStream::ReusableStringStream(&local_80);
      pRVar2 = ReusableStringStream::operator<<
                         (&local_80,(char (*) [44])"Could not create colour impl for selection ");
      local_84 = (uint)stream_local._7_1_;
      pRVar2 = ReusableStringStream::operator<<(pRVar2,(int *)&local_84);
      ReusableStringStream::str_abi_cxx11_(&local_70,pRVar2);
      throw_domain_error(&local_70);
    }
    bVar1 = anon_unknown_26::ANSIColourImpl::useImplementationForStream(stream);
    if (bVar1) {
      Detail::make_unique<Catch::(anonymous_namespace)::ANSIColourImpl,Catch::IStream*&>
                ((Detail *)&local_48,&local_20);
      Detail::unique_ptr<Catch::ColourImpl>::
      unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl,void>
                ((unique_ptr<Catch::ColourImpl> *)this,&local_48);
      Detail::unique_ptr<Catch::(anonymous_namespace)::ANSIColourImpl>::~unique_ptr(&local_48);
    }
    else {
      Detail::make_unique<Catch::(anonymous_namespace)::NoColourImpl,Catch::IStream*&>
                ((Detail *)&local_50,&local_20);
      Detail::unique_ptr<Catch::ColourImpl>::
      unique_ptr<Catch::(anonymous_namespace)::NoColourImpl,void>
                ((unique_ptr<Catch::ColourImpl> *)this,&local_50);
      Detail::unique_ptr<Catch::(anonymous_namespace)::NoColourImpl>::~unique_ptr(&local_50);
    }
  }
  return (unique_ptr<Catch::ColourImpl>)(ColourImpl *)this;
}

Assistant:

Detail::unique_ptr<ColourImpl> makeColourImpl( ColourMode implSelection,
                                                   IStream* stream ) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
        if ( implSelection == ColourMode::Win32 ) {
            return Detail::make_unique<Win32ColourImpl>( stream );
        }
#endif
        if ( implSelection == ColourMode::ANSI ) {
            return Detail::make_unique<ANSIColourImpl>( stream );
        }
        if ( implSelection == ColourMode::None ) {
            return Detail::make_unique<NoColourImpl>( stream );
        }

        if ( implSelection == ColourMode::PlatformDefault) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
            if ( Win32ColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<Win32ColourImpl>( stream );
            }
#endif
            if ( ANSIColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<ANSIColourImpl>( stream );
            }
            return Detail::make_unique<NoColourImpl>( stream );
        }

        CATCH_ERROR( "Could not create colour impl for selection " << static_cast<int>(implSelection) );
    }